

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

bool __thiscall
GEO::Delaunay2d::create_first_triangle(Delaunay2d *this,index_t *iv0,index_t *iv1,index_t *iv2)

{
  char cVar1;
  double *pdVar2;
  pointer piVar3;
  int iVar4;
  uint uVar5;
  Sign SVar6;
  index_t iVar7;
  index_t iVar8;
  uint uVar9;
  index_t *piVar10;
  ulong uVar11;
  ulong uVar12;
  index_t e;
  long lVar13;
  index_t t [3];
  
  if ((this->super_Delaunay).nb_vertices_ < 3) {
    return false;
  }
  *iv0 = 0;
  pdVar2 = (this->super_Delaunay).vertices_;
  uVar5 = 1;
  while( true ) {
    *iv1 = uVar5;
    uVar9 = (this->super_Delaunay).nb_vertices_;
    if (uVar9 <= uVar5) break;
    iVar7 = (this->super_Delaunay).vertex_stride_;
    uVar12 = (ulong)(*iv0 * iVar7);
    uVar11 = (ulong)(iVar7 * uVar5);
    if ((((pdVar2[uVar12] != pdVar2[uVar11]) || (NAN(pdVar2[uVar12]) || NAN(pdVar2[uVar11]))) ||
        (pdVar2[uVar12 + 1] != pdVar2[uVar11 + 1])) ||
       (NAN(pdVar2[uVar12 + 1]) || NAN(pdVar2[uVar11 + 1]))) break;
    uVar5 = uVar5 + 1;
  }
  piVar10 = iv1;
  if (uVar5 != uVar9) {
    do {
      uVar9 = *piVar10 + 1;
      *iv2 = uVar9;
      uVar5 = (this->super_Delaunay).nb_vertices_;
      if (uVar5 <= uVar9) {
        if (uVar9 == uVar5) {
          return false;
        }
        goto LAB_001574e4;
      }
      pdVar2 = (this->super_Delaunay).vertices_;
      iVar7 = (this->super_Delaunay).vertex_stride_;
      SVar6 = PCK::orient_2d(pdVar2 + *iv0 * iVar7,pdVar2 + *iv1 * iVar7,pdVar2 + uVar9 * iVar7);
      piVar10 = iv2;
    } while (SVar6 == ZERO);
    uVar5 = *iv2;
    if (uVar5 != (this->super_Delaunay).nb_vertices_) {
      uVar9 = uVar5;
      if (SVar6 == NEGATIVE) {
        uVar9 = *iv1;
        *iv1 = uVar5;
        *iv2 = uVar9;
      }
LAB_001574e4:
      iVar7 = new_triangle(this,*iv0,*iv1,uVar9);
      iVar4 = iVar7 * 3;
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        piVar3 = (this->cell_to_v_store_).
                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = new_triangle(this,-1,piVar3[(uint)((char)(&DAT_001b1706)[lVar13 * 2] + iVar4)],
                             piVar3[(uint)((char)(&triangle_edge_vertex_)[lVar13 * 2] + iVar4)]);
        t[lVar13] = iVar8;
      }
      piVar3 = (this->cell_to_cell_store_).
               super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
               super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        iVar8 = t[lVar13];
        piVar3[iVar8 * 3] = iVar7;
        piVar3[(uint)(iVar4 + (int)lVar13)] = iVar8;
      }
      for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
        cVar1 = (&triangle_edge_vertex_)[lVar13 * 2];
        iVar7 = t[lVar13];
        piVar3[iVar7 * 3 + 1] = t[(uint)(int)(char)(&DAT_001b1706)[lVar13 * 2]];
        piVar3[iVar7 * 3 + 2] = t[(long)cVar1 & 0xffffffff];
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Delaunay2d::create_first_triangle(
        index_t& iv0, index_t& iv1, index_t& iv2
    ) {
        if(nb_vertices() < 3) {
            return false;
        }

        iv0 = 0;

        iv1 = 1;
        while(
            iv1 < nb_vertices() &&
            PCK::points_are_identical_2d(
                vertex_ptr(iv0), vertex_ptr(iv1)
            )
        ) {
            ++iv1;
        }
        if(iv1 == nb_vertices()) {
            return false;
        }

        iv2 = iv1 + 1;
	Sign s = ZERO;
        while(
            iv2 < nb_vertices() &&  
	    (s = PCK::orient_2d(vertex_ptr(iv0), vertex_ptr(iv1), vertex_ptr(iv2))) == ZERO
	) {
            ++iv2;
        }
        if(iv2 == nb_vertices()) {
            return false;
        }
	if(s == NEGATIVE) {
	    std::swap(iv1,iv2);
	}
	    
        // Create the first triangle
        index_t t0 = new_triangle(
            signed_index_t(iv0), 
            signed_index_t(iv1), 
            signed_index_t(iv2)
        );

        // Create the first three virtual triangles surrounding it
        index_t t[3];
        for(index_t e = 0; e < 3; ++e) {
            // In reverse order since it is an adjacent tetrahedron
            signed_index_t v1 = triangle_vertex(t0, triangle_edge_vertex(e,1));
            signed_index_t v2 = triangle_vertex(t0, triangle_edge_vertex(e,0));
            t[e] = new_triangle(VERTEX_AT_INFINITY, v1, v2);
        }

        // Connect the virtual triangles to the real one
        for(index_t e=0; e<3; ++e) {
            set_triangle_adjacent(t[e], 0, t0);
            set_triangle_adjacent(t0, e, t[e]);
        }

        // Interconnect the three virtual triangles along their common
        // edges
        for(index_t e = 0; e < 3; ++e) {
            // In reverse order since it is an adjacent tetrahedron
            index_t lv1 = triangle_edge_vertex(e,1);
            index_t lv2 = triangle_edge_vertex(e,0);
            set_triangle_adjacent(t[e], 1, t[lv1]);
            set_triangle_adjacent(t[e], 2, t[lv2]);
        }

        return true;
    }